

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int wb_set_offset(archive_write *a,int64_t off)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t size;
  long lVar5;
  long lVar6;
  
  pvVar1 = a->format_data;
  if (*(int *)((long)pvVar1 + 0x102e8) != 1) {
    archive_set_error(&a->archive,-1,"Internal Programing error: iso9660:wb_set_offset()");
    return -0x1e;
  }
  lVar5 = *(long *)((long)pvVar1 + 0x102f0);
  lVar6 = (lVar5 - *(long *)((long)pvVar1 + 0x102e0)) + 0x10000;
  lVar3 = *(long *)((long)pvVar1 + 0x10300);
  if (*(long *)((long)pvVar1 + 0x10300) < lVar6) {
    *(long *)((long)pvVar1 + 0x10300) = lVar6;
    lVar3 = lVar6;
  }
  sVar4 = 0x10000 - *(long *)((long)pvVar1 + 0x102e0);
  lVar6 = *(long *)((long)pvVar1 + 0x102f8);
  if (lVar5 < lVar6) {
    if (0 < (long)sVar4) {
      iVar2 = write_to_temp(a,(void *)((long)pvVar1 + 0x2dc),sVar4);
      if (iVar2 != 0) {
        return -0x1e;
      }
      lVar6 = *(__off_t *)((long)pvVar1 + 0x102f8);
    }
    *(long *)((long)pvVar1 + 0x102f0) = lVar6;
    lseek(*(int *)((long)pvVar1 + 8),lVar6,0);
    *(undefined8 *)((long)pvVar1 + 0x102e0) = 0x10000;
    lVar5 = *(long *)((long)pvVar1 + 0x102f0);
    if (lVar5 <= off) {
      lVar3 = *(long *)((long)pvVar1 + 0x10300);
LAB_0032d183:
      sVar4 = off - lVar3;
      if (sVar4 != 0 && lVar3 <= off) {
        size = (lVar5 - lVar3) + 0x10000;
        *(size_t *)((long)pvVar1 + 0x102e0) = size;
        for (; (long)size <= (long)sVar4; sVar4 = sVar4 - size) {
          iVar2 = write_null(a,size);
          if (iVar2 != 0) {
            return -0x1e;
          }
          size = *(size_t *)((long)pvVar1 + 0x102e0);
        }
        if ((long)sVar4 < 1) {
          return 0;
        }
        iVar2 = write_null(a,sVar4);
        if (iVar2 == 0) {
          return 0;
        }
        return -0x1e;
      }
      lVar5 = (lVar5 - off) + 0x10000;
      goto LAB_0032d1c8;
    }
  }
  else {
    if (lVar5 <= off) goto LAB_0032d183;
    if ((0 < (long)sVar4) && (iVar2 = wb_write_out(a), iVar2 != 0)) {
      return -0x1e;
    }
  }
  lseek(*(int *)((long)pvVar1 + 8),off,0);
  *(int64_t *)((long)pvVar1 + 0x102f0) = off;
  lVar5 = 0x10000;
LAB_0032d1c8:
  *(long *)((long)pvVar1 + 0x102e0) = lVar5;
  return 0;
}

Assistant:

static int
wb_set_offset(struct archive_write *a, int64_t off)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
	int64_t used, ext_bytes;

	if (iso9660->wbuff_type != WB_TO_TEMP) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal Programing error: iso9660:wb_set_offset()");
		return (ARCHIVE_FATAL);
	}

	used = sizeof(iso9660->wbuff) - iso9660->wbuff_remaining;
	if (iso9660->wbuff_offset + used > iso9660->wbuff_tail)
		iso9660->wbuff_tail = iso9660->wbuff_offset + used;
	if (iso9660->wbuff_offset < iso9660->wbuff_written) {
		if (used > 0 &&
		    write_to_temp(a, iso9660->wbuff, (size_t)used) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		iso9660->wbuff_offset = iso9660->wbuff_written;
		lseek(iso9660->temp_fd, iso9660->wbuff_offset, SEEK_SET);
		iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
		used = 0;
	}
	if (off < iso9660->wbuff_offset) {
		/*
		 * Write out waiting data.
		 */
		if (used > 0) {
			if (wb_write_out(a) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}
		lseek(iso9660->temp_fd, off, SEEK_SET);
		iso9660->wbuff_offset = off;
		iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
	} else if (off <= iso9660->wbuff_tail) {
		iso9660->wbuff_remaining = (size_t)
		    (sizeof(iso9660->wbuff) - (off - iso9660->wbuff_offset));
	} else {
		ext_bytes = off - iso9660->wbuff_tail;
		iso9660->wbuff_remaining = (size_t)(sizeof(iso9660->wbuff)
		   - (iso9660->wbuff_tail - iso9660->wbuff_offset));
		while (ext_bytes >= (int64_t)iso9660->wbuff_remaining) {
			if (write_null(a, (size_t)iso9660->wbuff_remaining)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			ext_bytes -= iso9660->wbuff_remaining;
		}
		if (ext_bytes > 0) {
			if (write_null(a, (size_t)ext_bytes) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}
	}
	return (ARCHIVE_OK);
}